

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O0

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<double,int>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          int *out_value)

{
  bool bVar1;
  uint uVar2;
  byte *pbVar3;
  long in_RCX;
  byte in_DL;
  GeometryAttribute *in_RDI;
  int i_1;
  double in_value;
  int i;
  uint8_t *src_address;
  undefined4 in_stack_ffffffffffffffc0;
  AttributeValueIndex in_stack_ffffffffffffffc4;
  int local_30;
  uint8_t *local_28;
  byte local_11 [17];
  
  local_11[0] = in_DL;
  local_28 = GetAddress(in_RDI,in_stack_ffffffffffffffc4);
  local_30 = 0;
  while( true ) {
    pbVar3 = std::min<unsigned_char>(&in_RDI->num_components_,local_11);
    if ((int)(uint)*pbVar3 <= local_30) {
      for (uVar2 = (uint)in_RDI->num_components_; (int)uVar2 < (int)(uint)local_11[0];
          uVar2 = uVar2 + 1) {
        *(undefined4 *)(in_RCX + (long)(int)uVar2 * 4) = 0;
      }
      return true;
    }
    bVar1 = IsAddressValid((GeometryAttribute *)
                           CONCAT44(in_stack_ffffffffffffffc4.value_,in_stack_ffffffffffffffc0),
                           (uint8_t *)in_RDI);
    if (!bVar1) break;
    bVar1 = ConvertComponentValue<double,int>
                      (*(double **)local_28,SUB41(in_stack_ffffffffffffffc4.value_ >> 0x18,0),
                       (int *)in_RDI);
    if (!bVar1) {
      return false;
    }
    local_28 = local_28 + 8;
    local_30 = local_30 + 1;
  }
  return false;
}

Assistant:

bool ConvertTypedValue(AttributeValueIndex att_id, uint8_t out_num_components,
                         OutT *out_value) const {
    const uint8_t *src_address = GetAddress(att_id);

    // Convert all components available in both the original and output formats.
    for (int i = 0; i < std::min(num_components_, out_num_components); ++i) {
      if (!IsAddressValid(src_address)) {
        return false;
      }
      const T in_value = *reinterpret_cast<const T *>(src_address);
      if (!ConvertComponentValue<T, OutT>(in_value, normalized_,
                                          out_value + i)) {
        return false;
      }
      src_address += sizeof(T);
    }
    // Fill empty data for unused output components if needed.
    for (int i = num_components_; i < out_num_components; ++i) {
      out_value[i] = static_cast<OutT>(0);
    }
    return true;
  }